

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.h
# Opt level: O0

void __thiscall Opcode::BVTCache::ResetCache(BVTCache *this)

{
  BVTCache *this_local;
  
  this->Model0 = (Model *)0x0;
  this->Model1 = (Model *)0x0;
  (this->super_Pair).id0 = 0;
  (this->super_Pair).id1 = 1;
  return;
}

Assistant:

void	ResetCache()
							{
								Model0			= null;
								Model1			= null;
								id0				= 0;
								id1				= 1;
#ifdef __MESHMERIZER_H__		// Collision hulls only supported within ICE !
								HullTest		= true;
								SepVector.pid	= 0;
								SepVector.qid	= 0;
								SepVector.SV	= Point(1.0f, 0.0f, 0.0f);
#endif // __MESHMERIZER_H__
							}